

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * columnTypeImpl(NameContext *pNC,Expr *pExpr)

{
  short sVar1;
  int iVar2;
  SrcList *pSVar3;
  Select *pSVar4;
  char *pcVar5;
  size_t sVar6;
  Table *pTVar7;
  uint uVar8;
  int *piVar9;
  Expr *pExpr_00;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  NameContext sNC;
  NameContext local_48;
  
  if (pExpr->op == 0x83) {
    local_48.pSrcList = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_0017506c:
    local_48.pParse = pNC->pParse;
    local_48.pNext = pNC;
    pcVar5 = columnTypeImpl(&local_48,pExpr_00);
  }
  else {
    if (pExpr->op == 0xa2) {
      if (pNC == (NameContext *)0x0) {
        bVar12 = true;
        pSVar4 = (Select *)0x0;
        pTVar7 = (Table *)0x0;
      }
      else {
        pTVar7 = (Table *)0x0;
        pSVar4 = (Select *)0x0;
        do {
          pSVar3 = pNC->pSrcList;
          uVar10 = (ulong)pSVar3->nSrc;
          bVar12 = 0 < (long)uVar10;
          if ((long)uVar10 < 1) {
LAB_00175040:
            pNC = pNC->pNext;
          }
          else {
            if (pSVar3->a[0].iCursor == pExpr->iTable) {
              uVar11 = 0;
            }
            else {
              uVar11 = 0;
              piVar9 = &pSVar3[1].a[0].regResult;
              do {
                if (uVar10 - 1 == uVar11) goto LAB_00175040;
                uVar11 = uVar11 + 1;
                iVar2 = *piVar9;
                piVar9 = piVar9 + 0x1c;
              } while (iVar2 != pExpr->iTable);
              bVar12 = uVar11 < uVar10;
            }
            if (!bVar12) goto LAB_00175040;
            pTVar7 = pSVar3->a[uVar11].pTab;
            pSVar4 = pSVar3->a[uVar11].pSelect;
          }
          bVar12 = pTVar7 == (Table *)0x0;
        } while ((pNC != (NameContext *)0x0) && (pTVar7 == (Table *)0x0));
      }
      if (!bVar12) {
        sVar1 = pExpr->iColumn;
        uVar8 = (uint)sVar1;
        if (pSVar4 == (Select *)0x0) {
          if (sVar1 < 0) {
            return "INTEGER";
          }
          if ((pTVar7->aCol[uVar8].colFlags & 4) != 0) {
            pcVar5 = pTVar7->aCol[uVar8].zName;
            sVar6 = strlen(pcVar5);
            return pcVar5 + sVar6 + 1;
          }
        }
        else if ((-1 < sVar1) && ((int)uVar8 < pSVar4->pEList->nExpr)) {
          local_48.pSrcList = pSVar4->pSrc;
          pExpr_00 = pSVar4->pEList->a[uVar8].pExpr;
          goto LAB_0017506c;
        }
      }
    }
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC, 
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  assert( pExpr->op!=TK_AGG_COLUMN );  /* This routine runes before aggregates
                                       ** are processed */
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer 
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the 
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression 
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol>=0 && iCol<pS->pEList->nExpr ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see 
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol); 
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS = pExpr->x.pSelect;
      Expr *p = pS->pEList->a[0].pExpr;
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol); 
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA  
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}